

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O0

void valid_deserialize_test(void *data,size_t size)

{
  char **expression;
  roaring_bitmap_t *file;
  char **in_RSI;
  roaring_bitmap_t *in_RDI;
  roaring_bitmap_t *bitmap;
  size_t serialized_size;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  
  expression = (char **)roaring_bitmap_portable_deserialize_size
                                  (in_stack_ffffffffffffffe0,
                                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (expression != in_RSI) {
    print_error("ERROR: expected size %zu, got %zu\n",in_RSI,expression);
    _fail(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  }
  roaring_bitmap_portable_deserialize_size
            (in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
            );
  _assert_int_equal((unsigned_long)in_RSI,(unsigned_long)expression,in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffdc);
  file = roaring_bitmap_portable_deserialize_safe((char *)in_RDI,(size_t)in_RSI);
  _assert_true((unsigned_long)in_RSI,(char *)expression,(char *)file,in_stack_ffffffffffffffdc);
  roaring_bitmap_internal_validate(in_RDI,in_RSI);
  _assert_true((unsigned_long)in_RSI,(char *)expression,(char *)file,in_stack_ffffffffffffffdc);
  roaring_bitmap_free((roaring_bitmap_t *)0x10339e);
  return;
}

Assistant:

static void valid_deserialize_test(const void* data, size_t size) {
    // Ensure that the data _looks_ like a valid bitmap, but is not.
    size_t serialized_size =
        roaring_bitmap_portable_deserialize_size(data, size);
    if (serialized_size != size) {
        fail_msg("expected size %zu, got %zu", size, serialized_size);
    }
    // If we truncate the data by one byte, we should get a size of 0
    assert_int_equal(roaring_bitmap_portable_deserialize_size(data, size - 1),
                     0);
    roaring_bitmap_t* bitmap =
        roaring_bitmap_portable_deserialize_safe(data, size);
    assert_non_null(bitmap);
    assert_true(roaring_bitmap_internal_validate(bitmap, NULL));
    roaring_bitmap_free(bitmap);
}